

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O0

void __thiscall ncnn::UnlockedPoolAllocator::~UnlockedPoolAllocator(UnlockedPoolAllocator *this)

{
  bool bVar1;
  pointer ppVar2;
  Allocator *in_RDI;
  void *ptr;
  iterator it;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffffc8;
  UnlockedPoolAllocatorPrivate *this_00;
  _Self in_stack_ffffffffffffffe8;
  _Self local_10 [2];
  
  in_RDI->_vptr_Allocator = (_func_int **)&PTR__UnlockedPoolAllocator_02022bf8;
  clear((UnlockedPoolAllocator *)in_stack_ffffffffffffffe8._M_node);
  bVar1 = std::__cxx11::
          list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
          ::empty((list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                   *)(in_RDI[1]._vptr_Allocator + 5));
  if (!bVar1) {
    fprintf(_stderr,"FATAL ERROR! unlocked pool allocator destroyed too early");
    fprintf(_stderr,"\n");
    local_10[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
         ::begin(in_stack_ffffffffffffffc8);
    while( true ) {
      std::__cxx11::
      list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
      end(in_stack_ffffffffffffffc8);
      bVar1 = std::operator!=(local_10,(_Self *)&stack0xffffffffffffffe8);
      if (!bVar1) break;
      ppVar2 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                         ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x1f8afff);
      fprintf(_stderr,"%p still in use",ppVar2->second);
      fprintf(_stderr,"\n");
      std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator++(local_10);
    }
  }
  this_00 = (UnlockedPoolAllocatorPrivate *)in_RDI[1]._vptr_Allocator;
  if (this_00 != (UnlockedPoolAllocatorPrivate *)0x0) {
    UnlockedPoolAllocatorPrivate::~UnlockedPoolAllocatorPrivate(this_00);
    operator_delete(this_00,0x40);
  }
  Allocator::~Allocator(in_RDI);
  return;
}

Assistant:

UnlockedPoolAllocator::~UnlockedPoolAllocator()
{
    clear();

    if (!d->payouts.empty())
    {
        NCNN_LOGE("FATAL ERROR! unlocked pool allocator destroyed too early");
#if NCNN_STDIO
        std::list<std::pair<size_t, void*> >::iterator it = d->payouts.begin();
        for (; it != d->payouts.end(); ++it)
        {
            void* ptr = it->second;
            NCNN_LOGE("%p still in use", ptr);
        }
#endif
    }

    delete d;
}